

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O3

QRect QHighDpi::toNativeWindowGeometry<QRect,QWindow>(QRect *value,QWindow *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double dVar10;
  QRect QVar11;
  
  iVar8 = 0;
  uVar6 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  if (context == (QWindow *)0x0) {
    iVar7 = 0;
  }
  else {
    cVar5 = QWindow::isTopLevel();
    iVar7 = 0;
    if (cVar5 != '\0') {
      iVar8 = (int)((ulong)uVar6 >> 0x20);
      iVar7 = (int)uVar6;
    }
  }
  uVar1 = value->x1;
  uVar2 = value->y1;
  dVar9 = (double)(uVar1 - iVar7) * extraout_XMM0_Qa;
  dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
  bVar3 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  dVar10 = (double)(uVar2 - iVar8) * extraout_XMM0_Qa;
  dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
  bVar4 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  QVar11.x1.m_i =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar9) + iVar7;
  iVar8 = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar10) + iVar8
  ;
  dVar10 = (double)(((value->x2).m_i - uVar1) + 1) * extraout_XMM0_Qa;
  dVar9 = (double)(((value->y2).m_i - uVar2) + 1) * extraout_XMM0_Qa;
  dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
  bVar3 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
  bVar4 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  QVar11.x2.m_i =
       (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar10) +
       QVar11.x1.m_i + -1;
  QVar11.y1.m_i = iVar8;
  QVar11.y2.m_i =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar9) + iVar8 +
       -1;
  return QVar11;
}

Assistant:

T toNativeWindowGeometry(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    QPoint effectiveOrigin = (context && context->isTopLevel()) ? so.origin : QPoint(0,0);
    return scale(value, so.factor, effectiveOrigin);
}